

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O1

EStatusCode __thiscall OpenTypeFileInput::ReadHMtx(OpenTypeFileInput *this)

{
  _Rb_tree_header *p_Var1;
  OpenTypePrimitiveReader *this_00;
  EStatusCode EVar2;
  unsigned_long uVar3;
  HMtxTable pHVar4;
  Trace *this_01;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  ulong uVar8;
  
  uVar3 = GetTag(this,"hmtx");
  p_Var1 = &(this->mTables)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar3]) {
    if (*(ulong *)(p_Var6 + 1) >= uVar3) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, uVar3 < *(ulong *)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    this_00 = &this->mPrimitivesReader;
    OpenTypePrimitiveReader::SetOffset(this_00,(LongFilePositionType)p_Var6[1]._M_left);
    pHVar4 = (HMtxTable)operator_new__((ulong)(this->mMaxp).NumGlyphs << 2);
    this->mHMtx = pHVar4;
    if ((this->mHHea).NumberOfHMetrics == 0) {
      uVar8 = 0;
    }
    else {
      lVar7 = 0;
      uVar8 = 0;
      do {
        OpenTypePrimitiveReader::ReadUSHORT
                  (this_00,(unsigned_short *)((long)&this->mHMtx->AdvanceWidth + lVar7));
        OpenTypePrimitiveReader::ReadSHORT
                  (this_00,(short *)((long)&this->mHMtx->LeftSideBearing + lVar7));
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 4;
      } while (uVar8 < (this->mHHea).NumberOfHMetrics);
    }
    if ((uint)uVar8 < (uint)(this->mMaxp).NumGlyphs) {
      uVar8 = uVar8 & 0xffffffff;
      lVar7 = uVar8 * 4 + 2;
      do {
        pHVar4 = this->mHMtx;
        pHVar4[uVar8].AdvanceWidth = pHVar4[(ulong)(this->mHHea).NumberOfHMetrics - 1].AdvanceWidth;
        OpenTypePrimitiveReader::ReadSHORT(this_00,(short *)((long)&pHVar4->AdvanceWidth + lVar7));
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 4;
      } while (uVar8 < (this->mMaxp).NumGlyphs);
    }
    EVar2 = OpenTypePrimitiveReader::GetInternalState(this_00);
    return EVar2;
  }
  this_01 = Trace::DefaultTrace();
  Trace::TraceToLog(this_01,"OpenTypeFileInput::ReadHMtx, could not find hmtx table");
  return eFailure;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadHMtx()
{
	ULongToTableEntryMap::iterator it = mTables.find(GetTag("hmtx"));
	if(it == mTables.end())
	{
		TRACE_LOG("OpenTypeFileInput::ReadHMtx, could not find hmtx table");
		return PDFHummus::eFailure;
	}

	mPrimitivesReader.SetOffset(it->second.Offset);

	mHMtx = new HMtxTableEntry[mMaxp.NumGlyphs];

	unsigned int i=0;

	for(; i < mHHea.NumberOfHMetrics;++i)
	{
		mPrimitivesReader.ReadUSHORT(mHMtx[i].AdvanceWidth);
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	for(; i < mMaxp.NumGlyphs; ++i)
	{
		mHMtx[i].AdvanceWidth = mHMtx[mHHea.NumberOfHMetrics-1].AdvanceWidth;
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	return mPrimitivesReader.GetInternalState();	
}